

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O3

int green_future_set_result(green_future_t future,void *p,int i)

{
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  int iVar1;
  
  if (future == (green_future_t)0x0) {
    iVar1 = 1;
  }
  else {
    if (future->refs < 1) {
      green_future_set_result_cold_1();
      if (future == (green_future_t)0x0) {
        return 1;
      }
      if (future->refs < 1) {
        green_future_result_cold_1();
        if (future == (green_future_t)0x0) {
          return 1;
        }
        if (0 < future->refs) {
          if (future->state != green_future_pending) {
            return 8;
          }
          future->state = green_future_aborted;
          return 0;
        }
        green_future_cancel_cold_1();
        halt_baddata();
      }
      if (future->state == green_future_pending) {
        return 3;
      }
      if (future->state == green_future_aborted) {
        return 8;
      }
      if ((undefined8 *)p != (undefined8 *)0x0) {
        *(void **)p = (future->result).p;
      }
      if (CONCAT44(extraout_var,extraout_EDX) != 0) {
        *(int *)CONCAT44(extraout_var,extraout_EDX) = (future->result).i;
      }
      return 0;
    }
    if (future->state == green_future_aborted) {
      iVar1 = 4;
    }
    else if (future->state == green_future_complete) {
      iVar1 = 8;
    }
    else {
      (future->result).i = i;
      (future->result).p = p;
      future->state = green_future_complete;
      iVar1 = 0;
      if (future->poller != (green_poller_t)0x0) {
        green_future_set_result_cold_2();
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int green_future_set_result(green_future_t future, void * p, int i)
{
    if (future == NULL) {
        return GREEN_EINVAL;
    }
    green_assert(future->refs > 0);

    if (future->state == green_future_aborted) {
        return GREEN_ECANCELED;
    }
    if (future->state == green_future_complete) {
        return GREEN_EBADFD;
    }

    // Store result.
    future->result.i = i;
    future->result.p = p;

    // Mark as complete.
    future->state = green_future_complete;

    // Restore poller invariant.
    if (future->poller) {
        green_poller_swap(future->poller,
                          future->slot, --future->poller->busy);

        // TODO: resume coroutine blocked on poller, if any.
    }

    return GREEN_SUCCESS;
}